

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::AddBoneChildren(SMDImporter *this,aiNode *pcNode,uint32_t iParent)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  aiNode **ppaVar4;
  aiNode *this_00;
  reference __src;
  reference pvVar5;
  aiMatrix4x4t<float> local_8c;
  aiNode *local_40;
  aiNode *pc;
  Bone *bone_1;
  uint i_1;
  uint qq;
  Bone *bone;
  uint i;
  uint32_t iParent_local;
  aiNode *pcNode_local;
  SMDImporter *this_local;
  
  bone._4_4_ = iParent;
  _i = pcNode;
  pcNode_local = (aiNode *)this;
  if (pcNode == (aiNode *)0x0) {
    __assert_fail("nullptr != pcNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19a,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  if (pcNode->mNumChildren != 0) {
    __assert_fail("0 == pcNode->mNumChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19b,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  if (pcNode->mChildren != (aiNode **)0x0) {
    __assert_fail("nullptr == pcNode->mChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19c,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  for (bone._0_4_ = 0; uVar3 = (ulong)(uint)bone,
      sVar2 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                        (&this->asBones), uVar3 < sVar2; bone._0_4_ = (uint)bone + 1) {
    _i_1 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                     (&this->asBones,(ulong)(uint)bone);
    if (_i_1->iParent == bone._4_4_) {
      _i->mNumChildren = _i->mNumChildren + 1;
    }
  }
  auVar1 = ZEXT416(_i->mNumChildren) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppaVar4 = (aiNode **)operator_new__(uVar3);
  _i->mChildren = ppaVar4;
  bone_1._4_4_ = 0;
  for (bone_1._0_4_ = 0; uVar3 = (ulong)(uint)bone_1,
      sVar2 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                        (&this->asBones), uVar3 < sVar2; bone_1._0_4_ = (uint)bone_1 + 1) {
    pc = (aiNode *)
         std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                   (&this->asBones,(ulong)(uint)bone_1);
    if (*(uint32_t *)((pc->mName).data + 0x1c) == bone._4_4_) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      _i->mChildren[bone_1._4_4_] = this_00;
      local_40 = this_00;
      bone_1._4_4_ = bone_1._4_4_ + 1;
      aiString::Set((aiString *)this_00,(string *)pc);
      sVar2 = std::
              vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
              ::size((vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      *)((pc->mName).data + 0x2c));
      if (sVar2 != 0) {
        __src = std::
                vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                ::operator[]((vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                              *)((pc->mName).data + 0x2c),0);
        memcpy(&local_40->mTransformation,__src,0x40);
      }
      if (*(int *)((pc->mName).data + 0x1c) == -1) {
        memcpy((pc->mName).data + 0x44,&local_40->mTransformation,0x40);
      }
      else {
        pvVar5 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                           (&this->asBones,(ulong)*(uint *)((pc->mName).data + 0x1c));
        aiMatrix4x4t<float>::operator*(&local_8c,&pvVar5->mOffsetMatrix,&local_40->mTransformation);
        memcpy((pc->mName).data + 0x44,&local_8c,0x40);
      }
      local_40->mParent = _i;
      AddBoneChildren(this,local_40,(uint)bone_1);
    }
  }
  return;
}

Assistant:

void SMDImporter::AddBoneChildren(aiNode* pcNode, uint32_t iParent) {
    ai_assert( nullptr != pcNode );
    ai_assert( 0 == pcNode->mNumChildren );
    ai_assert( nullptr == pcNode->mChildren);

    // first count ...
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent == iParent) {
            ++pcNode->mNumChildren;
        }
    }

    // now allocate the output array
    pcNode->mChildren = new aiNode*[pcNode->mNumChildren];

    // and fill all subnodes
    unsigned int qq( 0 );
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent != iParent) {
            continue;
        }

        aiNode* pc = pcNode->mChildren[qq++] = new aiNode();
        pc->mName.Set(bone.mName);

        // store the local transformation matrix of the bind pose
        if (bone.sAnim.asKeys.size()) {
            pc->mTransformation = bone.sAnim.asKeys[0].matrix;
        }

        if (bone.iParent == static_cast<uint32_t>(-1)) { 
            bone.mOffsetMatrix = pc->mTransformation;
        } else {
            bone.mOffsetMatrix = asBones[bone.iParent].mOffsetMatrix * pc->mTransformation;
        }

        pc->mParent = pcNode;

        // add children to this node, too
        AddBoneChildren(pc,i);
    }
}